

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O0

int __thiscall PyCode::generateMFStructPy(PyCode *this,string *cwd)

{
  byte bVar1;
  FileNotOpenException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [8];
  string path;
  long local_218;
  ofstream ofs;
  string *cwd_local;
  PyCode *this_local;
  
  std::ofstream::ofstream(&local_218);
  std::operator+(local_248,(char *)cwd);
  std::ofstream::open((string *)&local_218,(_Ios_Openmode)local_248);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::ios::clear((long)&local_218 + *(long *)(local_218 + -0x18),0);
    std::ofstream::close();
    this_00 = (FileNotOpenException *)__cxa_allocate_exception(8);
    *this_00 = (FileNotOpenException)0x0;
    ParserClassException::FileNotOpenException::FileNotOpenException(this_00);
    __cxa_throw(this_00,&ParserClassException::FileNotOpenException::typeinfo,
                ParserClassException::FileNotOpenException::~FileNotOpenException);
  }
  std::operator<<((ostream *)&local_218,"import json\n");
  std::operator<<((ostream *)&local_218,"from collections import defaultdict\n");
  std::operator<<((ostream *)&local_218,"\n");
  std::operator<<((ostream *)&local_218,"class operateClass():\n");
  std::operator<<((ostream *)&local_218,
                  "\tagg_func_enum = (\"sum\", \"max\", \"min\", \"count\", \"avg\")\n");
  std::operator<<((ostream *)&local_218,
                  "\tdef __init__(self, selectAttr : str, havingCond : str, size : int, group_attr, agg_func, select_cond):\n"
                 );
  std::operator<<((ostream *)&local_218,"\t\tself.select_attr_agg_func = selectAttr.split(\", \")\n"
                 );
  std::operator<<((ostream *)&local_218,"\t\tself.select_attr_parsed = []\n");
  std::operator<<((ostream *)&local_218,"\t\tself.having_conds = havingCond\n");
  std::operator<<((ostream *)&local_218,"\t\tself.group_attr = group_attr\n");
  std::operator<<((ostream *)&local_218,"\t\tself.agg_func = agg_func\n");
  std::operator<<((ostream *)&local_218,"\t\tself.agg_func_parsed = defaultdict(str)\n");
  std::operator<<((ostream *)&local_218,"\t\tself.select_conds = select_cond\n");
  std::operator<<((ostream *)&local_218,"\t\tself.part_size = size\n");
  std::operator<<((ostream *)&local_218,"\n");
  std::operator<<((ostream *)&local_218,"\tdef parse_agg_group(self):\n");
  std::operator<<((ostream *)&local_218,"\t\tfor var_name, func_name in self.agg_func.items():\n");
  std::operator<<((ostream *)&local_218,
                  "\t\t\tself.agg_func_parsed[var_name] = self.parse_agg_func(func_name)\n");
  std::operator<<((ostream *)&local_218,"\n");
  std::operator<<((ostream *)&local_218,"\t@staticmethod\n");
  std::operator<<((ostream *)&local_218,"\tdef parse_agg_func(unparsed_agg_func):\n");
  std::operator<<((ostream *)&local_218,"\t\t\'\'\'\n");
  std::operator<<((ostream *)&local_218,"\t\t\t@input: sum_varname\n");
  std::operator<<((ostream *)&local_218,"\t\t\t@param: unparsed_agg_func : str\n");
  std::operator<<((ostream *)&local_218,"\t\t\t@return: {sum(varname) : 0} : dict\n");
  std::operator<<((ostream *)&local_218,"\t\t\'\'\'\n");
  std::operator<<((ostream *)&local_218,"\t\tparsed_func = []\n");
  std::operator<<((ostream *)&local_218,"\t\tfor item in unparsed_agg_func:\n");
  std::operator<<((ostream *)&local_218,"\t\t\tfuc_lst = item.split(\'_\')\n");
  std::operator<<((ostream *)&local_218,"\t\t\tif len(fuc_lst) == 3:\n");
  std::operator<<((ostream *)&local_218,"\t\t\t\tif fuc_lst[1] in operateClass.agg_func_enum:\n");
  std::operator<<((ostream *)&local_218,
                  "\t\t\t\t\tparsed_func.append(fuc_lst[1] + \'(\' + fuc_lst[2] + \')\')\n");
  std::operator<<((ostream *)&local_218,"\t\t\t\telse:\n");
  std::operator<<((ostream *)&local_218,
                  "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n"
                 );
  std::operator<<((ostream *)&local_218,"\t\t\tif len(fuc_lst) == 2:\n");
  std::operator<<((ostream *)&local_218,"\t\t\t\tif fuc_lst[0] in operateClass.agg_func_enum:\n");
  std::operator<<((ostream *)&local_218,
                  "\t\t\t\t\tparsed_func.append(fuc_lst[0] + \'(\' + fuc_lst[1] + \')\')\n");
  std::operator<<((ostream *)&local_218,"\t\t\t\telse:\n");
  std::operator<<((ostream *)&local_218,
                  "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n"
                 );
  std::operator<<((ostream *)&local_218,"\t\treturn parsed_func\n");
  std::operator<<((ostream *)&local_218,"\n");
  std::operator<<((ostream *)&local_218,"\tdef parse_select_attr(self):\n");
  std::operator<<((ostream *)&local_218,"\t\tfor item in self.select_attr_agg_func:\n");
  std::operator<<((ostream *)&local_218,"\t\t\tif item in self.group_attr:\n");
  std::operator<<((ostream *)&local_218,"\t\t\t\tself.select_attr_parsed.append(item)\n");
  std::operator<<((ostream *)&local_218,"\t\t\telse:\n");
  std::operator<<((ostream *)&local_218,"\t\t\t\ttmp = item.split(\"_\")\n");
  std::operator<<((ostream *)&local_218,
                  "\t\t\t\tself.select_attr_parsed.append(tmp[1] + \"({}.{})\".format(tmp[0], tmp[2]))\n"
                 );
  std::operator<<((ostream *)&local_218,"\n");
  std::operator<<((ostream *)&local_218,"class MFTable():\n");
  std::operator<<((ostream *)&local_218,
                  "\tdef __init__(self, attr_lst : list, agg_lst : list = []):\n");
  std::operator<<((ostream *)&local_218,"\t\tself.group_attr = dict.fromkeys(attr_lst, 0)\n");
  std::operator<<((ostream *)&local_218,"\t\tself.agg_func = defaultdict(int)\n");
  std::ios::clear((long)&local_218 + *(long *)(local_218 + -0x18),0);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)local_248);
  std::ofstream::~ofstream(&local_218);
  return 0;
}

Assistant:

int PyCode::generateMFStructPy(std::string cwd) throw()
{
    std::ofstream ofs;
    std::string path = cwd + "/MFStruct.py";
    ofs.open(path, std::ios::out);
    if (!ofs.is_open())
    {
        ofs.clear();
        ofs.close();
        throw ParserClassException::FileNotOpenException();
    }
    else
    {
        ofs << "import json\n";
        ofs << "from collections import defaultdict\n";
        ofs << "\n";
        ofs << "class operateClass():\n";
        ofs << "\tagg_func_enum = (\"sum\", \"max\", \"min\", \"count\", \"avg\")\n";
        ofs << "\tdef __init__(self, selectAttr : str, havingCond : str, size : int, group_attr, agg_func, select_cond):\n";
        ofs << "\t\tself.select_attr_agg_func = selectAttr.split(\", \")\n";
        ofs << "\t\tself.select_attr_parsed = []\n";
        ofs << "\t\tself.having_conds = havingCond\n";
        ofs << "\t\tself.group_attr = group_attr\n";
        ofs << "\t\tself.agg_func = agg_func\n";
        ofs << "\t\tself.agg_func_parsed = defaultdict(str)\n";
        ofs << "\t\tself.select_conds = select_cond\n";
        ofs << "\t\tself.part_size = size\n";
        ofs << "\n";
        ofs << "\tdef parse_agg_group(self):\n";
        ofs << "\t\tfor var_name, func_name in self.agg_func.items():\n";
        ofs << "\t\t\tself.agg_func_parsed[var_name] = self.parse_agg_func(func_name)\n";
        ofs << "\n";
        ofs << "\t@staticmethod\n";
        ofs << "\tdef parse_agg_func(unparsed_agg_func):\n";
        ofs << "\t\t\'\'\'\n";
        ofs << "\t\t\t@input: sum_varname\n";
        ofs << "\t\t\t@param: unparsed_agg_func : str\n";
        ofs << "\t\t\t@return: {sum(varname) : 0} : dict\n";
        ofs << "\t\t\'\'\'\n";
        ofs << "\t\tparsed_func = []\n";
        ofs << "\t\tfor item in unparsed_agg_func:\n";
        ofs << "\t\t\tfuc_lst = item.split('_')\n";
        ofs << "\t\t\tif len(fuc_lst) == 3:\n";
        ofs << "\t\t\t\tif fuc_lst[1] in operateClass.agg_func_enum:\n";
        ofs << "\t\t\t\t\tparsed_func.append(fuc_lst[1] + \'(\' + fuc_lst[2] + \')\')\n";
        ofs << "\t\t\t\telse:\n";
        ofs << "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n";
        ofs << "\t\t\tif len(fuc_lst) == 2:\n";
        ofs << "\t\t\t\tif fuc_lst[0] in operateClass.agg_func_enum:\n";
        ofs << "\t\t\t\t\tparsed_func.append(fuc_lst[0] + \'(\' + fuc_lst[1] + \')\')\n";
        ofs << "\t\t\t\telse:\n";
        ofs << "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n";
        ofs << "\t\treturn parsed_func\n";
        ofs << "\n";
        ofs << "\tdef parse_select_attr(self):\n";
        ofs << "\t\tfor item in self.select_attr_agg_func:\n";
        ofs << "\t\t\tif item in self.group_attr:\n";
        ofs << "\t\t\t\tself.select_attr_parsed.append(item)\n";
        ofs << "\t\t\telse:\n";
        ofs << "\t\t\t\ttmp = item.split(\"_\")\n";
        ofs << "\t\t\t\tself.select_attr_parsed.append(tmp[1] + \"({}.{})\".format(tmp[0], tmp[2]))\n";
        ofs << "\n";
        ofs << "class MFTable():\n";
        ofs << "\tdef __init__(self, attr_lst : list, agg_lst : list = []):\n";
        ofs << "\t\tself.group_attr = dict.fromkeys(attr_lst, 0)\n";
        ofs << "\t\tself.agg_func = defaultdict(int)\n";
        ofs.clear();
        ofs.close();
    }
    return 0;
}